

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall HighsSymmetryDetection::determineNextToDistinguish(HighsSymmetryDetection *this)

{
  vector<int_*,_std::allocator<int_*>_> *this_00;
  pointer pNVar1;
  pointer piVar2;
  pointer ppiVar3;
  int *piVar4;
  pointer ppiVar5;
  bool bVar6;
  HighsInt HVar7;
  int *in_RAX;
  long lVar8;
  pointer ppiVar9;
  pointer ppiVar10;
  long lVar11;
  pointer ppiVar12;
  int *piVar13;
  int *local_38;
  
  pNVar1 = (this->nodeStack).
           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppiVar9 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppiVar9) {
    (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar9;
  }
  this_00 = &this->distinguishCands;
  lVar8 = (long)pNVar1[-1].targetCell;
  piVar2 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar13 = piVar2 + lVar8;
  lVar11 = (long)(this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar8];
  if (pNVar1[-1].lastDistiguished == -1) {
    local_38 = (int *)std::
                      __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                                (piVar13,piVar2 + lVar11);
    std::vector<int*,std::allocator<int*>>::emplace_back<int*>
              ((vector<int*,std::allocator<int*>> *)this_00,&local_38);
  }
  else {
    local_38 = in_RAX;
    if (this->firstPathDepth <
        (int)((ulong)((long)pNVar1 -
                     (long)(this->nodeStack).
                           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      for (lVar8 = lVar11 * 4 + lVar8 * -4; lVar8 != 0; lVar8 = lVar8 + -4) {
        if ((pNVar1[-1].lastDistiguished < *piVar13) &&
           (bVar6 = checkStoredAutomorphism(this,*piVar13), bVar6)) {
          local_38 = piVar13;
          std::vector<int*,std::allocator<int*>>::emplace_back<int*>
                    ((vector<int*,std::allocator<int*>> *)this_00,&local_38);
        }
        piVar13 = piVar13 + 1;
      }
      ppiVar9 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppiVar3 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppiVar5 = ppiVar9;
      ppiVar10 = ppiVar9;
      if (ppiVar9 == ppiVar3) {
        return false;
      }
      while( true ) {
        ppiVar12 = ppiVar5;
        ppiVar10 = ppiVar10 + 1;
        piVar13 = *ppiVar12;
        if (ppiVar10 == ppiVar3) break;
        ppiVar5 = ppiVar10;
        if (*piVar13 <= **ppiVar10) {
          ppiVar5 = ppiVar12;
        }
      }
    }
    else {
      for (lVar8 = lVar11 * 4 + lVar8 * -4; lVar8 != 0; lVar8 = lVar8 + -4) {
        if ((pNVar1[-1].lastDistiguished < *piVar13) &&
           (HVar7 = getOrbit(this,*piVar13),
           (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[HVar7] == *piVar13)) {
          local_38 = piVar13;
          std::vector<int*,std::allocator<int*>>::emplace_back<int*>
                    ((vector<int*,std::allocator<int*>> *)this_00,&local_38);
        }
        piVar13 = piVar13 + 1;
      }
      ppiVar9 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppiVar3 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppiVar5 = ppiVar9;
      ppiVar10 = ppiVar9;
      if (ppiVar9 == ppiVar3) {
        return false;
      }
      while( true ) {
        ppiVar12 = ppiVar5;
        ppiVar10 = ppiVar10 + 1;
        piVar13 = *ppiVar12;
        if (ppiVar10 == ppiVar3) break;
        ppiVar5 = ppiVar10;
        if (*piVar13 <= **ppiVar10) {
          ppiVar5 = ppiVar12;
        }
      }
    }
    piVar4 = *ppiVar9;
    *ppiVar9 = piVar13;
    *ppiVar12 = piVar4;
    std::vector<int_*,_std::allocator<int_*>_>::resize(this_00,1);
  }
  return true;
}

Assistant:

bool HighsSymmetryDetection::determineNextToDistinguish() {
  Node& currNode = nodeStack.back();
  distinguishCands.clear();
  std::vector<HighsInt>::iterator cellStart;
  std::vector<HighsInt>::iterator cellEnd;
  cellStart = currentPartition.begin() + currNode.targetCell;
  cellEnd =
      currentPartition.begin() + currentPartitionLinks[currNode.targetCell];

  if (currNode.lastDistiguished == -1) {
    auto nextDistinguishPos = std::min_element(cellStart, cellEnd);
    distinguishCands.push_back(&*nextDistinguishPos);
  } else if ((HighsInt)nodeStack.size() > firstPathDepth) {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && checkStoredAutomorphism(*i))
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  } else {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && vertexGroundSet[getOrbit(*i)] == *i)
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  }

  return true;
}